

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_decode_cblks(opj_tcd_t *tcd,OPJ_BOOL *pret,opj_tcd_tilecomp_t *tilec,opj_tccp_t *tccp,
                        opj_event_mgr_t *p_manager,opj_mutex_t *p_manager_mutex,OPJ_BOOL check_pterm
                        )

{
  opj_thread_pool_t *tp;
  opj_tcd_resolution_t *poVar1;
  opj_tcd_precinct_t *poVar2;
  opj_tcd_cblk_dec_t *poVar3;
  void *pvVar4;
  opj_tcd_cblk_enc_t *poVar5;
  bool bVar6;
  OPJ_BOOL OVar7;
  opj_tcd_band_t *poVar8;
  OPJ_BOOL *user_data;
  int iVar9;
  OPJ_UINT32 resno;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  ulong local_98;
  ulong local_88;
  
  if (tilec->minimum_num_resolutions != 0) {
    tp = tcd->thread_pool;
    local_98 = 0;
    do {
      poVar1 = tilec->resolutions;
      if (poVar1[local_98].numbands != 0) {
        local_88 = 0;
        do {
          if (poVar1[local_98].ph * poVar1[local_98].pw != 0) {
            poVar8 = poVar1[local_98].bands + local_88;
            uVar10 = 0;
            do {
              poVar2 = poVar8->precincts;
              resno = (OPJ_UINT32)local_98;
              OVar7 = opj_tcd_is_subband_area_of_interest
                                (tcd,tilec->compno,resno,poVar8->bandno,poVar2[uVar10].x0,
                                 poVar2[uVar10].y0,poVar2[uVar10].x1,poVar2[uVar10].y1);
              iVar9 = poVar2[uVar10].ch * poVar2[uVar10].cw;
              if (OVar7 == 0) {
                bVar15 = 10;
                if (iVar9 != 0) {
                  lVar11 = 0x40;
                  uVar12 = 0;
                  do {
                    poVar5 = poVar2[uVar10].cblks.enc;
                    pvVar4 = *(void **)((long)&poVar5->data + lVar11);
                    if (pvVar4 != (void *)0x0) {
                      opj_aligned_free(pvVar4);
                      *(undefined8 *)((long)&poVar5->data + lVar11) = 0;
                    }
                    uVar12 = uVar12 + 1;
                    lVar11 = lVar11 + 0x48;
                  } while (uVar12 < poVar2[uVar10].ch * poVar2[uVar10].cw);
                }
              }
              else {
                if (iVar9 != 0) {
                  lVar11 = 0;
                  uVar12 = 0;
                  do {
                    poVar3 = poVar2[uVar10].cblks.dec;
                    OVar7 = opj_tcd_is_subband_area_of_interest
                                      (tcd,tilec->compno,resno,poVar8->bandno,
                                       *(OPJ_UINT32 *)((long)&poVar3->x0 + lVar11),
                                       *(OPJ_UINT32 *)((long)&poVar3->y0 + lVar11),
                                       *(OPJ_UINT32 *)((long)&poVar3->x1 + lVar11),
                                       *(OPJ_UINT32 *)((long)&poVar3->y1 + lVar11));
                    if (OVar7 == 0) {
                      pvVar4 = *(void **)((long)&poVar3->decoded_data + lVar11);
                      bVar15 = 0x10;
                      if (pvVar4 != (void *)0x0) {
                        opj_aligned_free(pvVar4);
                        *(undefined8 *)((long)&poVar3->decoded_data + lVar11) = 0;
                      }
                    }
                    else {
                      if (tcd->whole_tile_decoding == 0) {
                        if (*(long *)((long)&poVar3->decoded_data + lVar11) == 0) {
                          bVar13 = *(int *)((long)&poVar3->x1 + lVar11) !=
                                   *(int *)((long)&poVar3->x0 + lVar11);
                          bVar14 = *(int *)((long)&poVar3->y1 + lVar11) !=
                                   *(int *)((long)&poVar3->y0 + lVar11);
                          bVar6 = bVar14 && bVar13;
                          bVar15 = (!bVar14 || !bVar13) << 4;
                        }
                        else {
                          bVar15 = 0x10;
                          bVar6 = false;
                        }
                        if (!bVar6) goto LAB_00124ed4;
                      }
                      user_data = (OPJ_BOOL *)opj_calloc(1,0x50);
                      if (user_data == (OPJ_BOOL *)0x0) {
                        *pret = 0;
                        bVar15 = 1;
                      }
                      else {
                        *user_data = tcd->whole_tile_decoding;
                        user_data[1] = resno;
                        *(long *)(user_data + 2) = (long)&poVar3->segs + lVar11;
                        *(opj_tcd_band_t **)(user_data + 4) = poVar8;
                        *(opj_tcd_tilecomp_t **)(user_data + 6) = tilec;
                        *(opj_tccp_t **)(user_data + 8) = tccp;
                        *(OPJ_BOOL **)(user_data + 0xc) = pret;
                        *(opj_mutex_t **)(user_data + 0x10) = p_manager_mutex;
                        *(opj_event_mgr_t **)(user_data + 0xe) = p_manager;
                        user_data[0x12] = check_pterm;
                        iVar9 = opj_thread_pool_get_thread_count(tp);
                        user_data[10] = (uint)(1 < iVar9);
                        opj_thread_pool_submit_job(tp,opj_t1_clbl_decode_processor,user_data);
                        bVar15 = *pret == 0;
                      }
                    }
LAB_00124ed4:
                    if ((bVar15 & 0xf) != 0) goto LAB_00124f39;
                    uVar12 = uVar12 + 1;
                    lVar11 = lVar11 + 0x48;
                  } while (uVar12 < poVar2[uVar10].ch * poVar2[uVar10].cw);
                }
                bVar15 = 0;
              }
LAB_00124f39:
              if ((bVar15 != 10) && (bVar15 != 0)) goto LAB_00124f64;
              uVar10 = uVar10 + 1;
            } while (uVar10 < poVar1[local_98].ph * poVar1[local_98].pw);
            bVar15 = 0;
LAB_00124f64:
            if (bVar15 != 0) {
              return;
            }
          }
          local_88 = local_88 + 1;
        } while (local_88 < poVar1[local_98].numbands);
      }
      local_98 = local_98 + 1;
    } while (local_98 < tilec->minimum_num_resolutions);
  }
  return;
}

Assistant:

void opj_t1_decode_cblks(opj_tcd_t* tcd,
                         volatile OPJ_BOOL* pret,
                         opj_tcd_tilecomp_t* tilec,
                         opj_tccp_t* tccp,
                         opj_event_mgr_t *p_manager,
                         opj_mutex_t* p_manager_mutex,
                         OPJ_BOOL check_pterm
                        )
{
    opj_thread_pool_t* tp = tcd->thread_pool;
    OPJ_UINT32 resno, bandno, precno, cblkno;

#ifdef DEBUG_VERBOSE
    OPJ_UINT32 codeblocks_decoded = 0;
    printf("Enter opj_t1_decode_cblks()\n");
#endif

    for (resno = 0; resno < tilec->minimum_num_resolutions; ++resno) {
        opj_tcd_resolution_t* res = &tilec->resolutions[resno];

        for (bandno = 0; bandno < res->numbands; ++bandno) {
            opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];

            for (precno = 0; precno < res->pw * res->ph; ++precno) {
                opj_tcd_precinct_t* precinct = &band->precincts[precno];

                if (!opj_tcd_is_subband_area_of_interest(tcd,
                        tilec->compno,
                        resno,
                        band->bandno,
                        (OPJ_UINT32)precinct->x0,
                        (OPJ_UINT32)precinct->y0,
                        (OPJ_UINT32)precinct->x1,
                        (OPJ_UINT32)precinct->y1)) {
                    for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                        opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                        if (cblk->decoded_data) {
#ifdef DEBUG_VERBOSE
                            printf("Discarding codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            opj_aligned_free(cblk->decoded_data);
                            cblk->decoded_data = NULL;
                        }
                    }
                    continue;
                }

                for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                    opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                    opj_t1_cblk_decode_processing_job_t* job;

                    if (!opj_tcd_is_subband_area_of_interest(tcd,
                            tilec->compno,
                            resno,
                            band->bandno,
                            (OPJ_UINT32)cblk->x0,
                            (OPJ_UINT32)cblk->y0,
                            (OPJ_UINT32)cblk->x1,
                            (OPJ_UINT32)cblk->y1)) {
                        if (cblk->decoded_data) {
#ifdef DEBUG_VERBOSE
                            printf("Discarding codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            opj_aligned_free(cblk->decoded_data);
                            cblk->decoded_data = NULL;
                        }
                        continue;
                    }

                    if (!tcd->whole_tile_decoding) {
                        OPJ_UINT32 cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
                        OPJ_UINT32 cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);
                        if (cblk->decoded_data != NULL) {
#ifdef DEBUG_VERBOSE
                            printf("Reusing codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            continue;
                        }
                        if (cblk_w == 0 || cblk_h == 0) {
                            continue;
                        }
#ifdef DEBUG_VERBOSE
                        printf("Decoding codeblock %d,%d at resno=%d, bandno=%d\n",
                               cblk->x0, cblk->y0, resno, bandno);
#endif
                    }

                    job = (opj_t1_cblk_decode_processing_job_t*) opj_calloc(1,
                            sizeof(opj_t1_cblk_decode_processing_job_t));
                    if (!job) {
                        *pret = OPJ_FALSE;
                        return;
                    }
                    job->whole_tile_decoding = tcd->whole_tile_decoding;
                    job->resno = resno;
                    job->cblk = cblk;
                    job->band = band;
                    job->tilec = tilec;
                    job->tccp = tccp;
                    job->pret = pret;
                    job->p_manager_mutex = p_manager_mutex;
                    job->p_manager = p_manager;
                    job->check_pterm = check_pterm;
                    job->mustuse_cblkdatabuffer = opj_thread_pool_get_thread_count(tp) > 1;
                    opj_thread_pool_submit_job(tp, opj_t1_clbl_decode_processor, job);
#ifdef DEBUG_VERBOSE
                    codeblocks_decoded ++;
#endif
                    if (!(*pret)) {
                        return;
                    }
                } /* cblkno */
            } /* precno */
        } /* bandno */
    } /* resno */

#ifdef DEBUG_VERBOSE
    printf("Leave opj_t1_decode_cblks(). Number decoded: %d\n", codeblocks_decoded);
#endif
    return;
}